

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  LuaType LVar1;
  ushort uVar2;
  Table *t_00;
  GCObject *pGVar3;
  RaviArray *pRVar4;
  TValue *slot;
  ulong uVar5;
  char *pcVar6;
  Value VVar7;
  lua_Number value;
  double dVar8;
  undefined1 auVar9 [16];
  
  LVar1 = t->tt_;
  if (LVar1 != 0x8005) {
    if (LVar1 == 0x8025) {
      pRVar4 = (RaviArray *)(t->value_).gc;
      if ((pRVar4->tt == '\x15') || (pRVar4->tt == '%')) {
        if (key->tt_ != 0x13) {
LAB_0012648a:
          luaG_typeerror(L,key,"index");
        }
        if (val->tt_ == 0x13) {
          uVar5 = (key->value_).i & 0xffffffff;
          if (pRVar4->len <= (uint)(key->value_).b) {
            value = (lua_Number)(val->value_).i;
LAB_001263d2:
            raviH_set_float(L,pRVar4,uVar5,value);
            return;
          }
          VVar7.n = (lua_Number)(val->value_).i;
        }
        else {
          if (val->tt_ != 3) {
            pcVar6 = "value cannot be converted to number";
            goto LAB_001264b5;
          }
          uVar5 = (key->value_).i & 0xffffffff;
          if (pRVar4->len <= (uint)(key->value_).b) {
            value = (val->value_).n;
            goto LAB_001263d2;
          }
          VVar7 = val->value_;
        }
        *(Value *)(pRVar4->data + uVar5 * 8) = VVar7;
        return;
      }
    }
    else {
      if (LVar1 != 0x8015) {
        slot = (TValue *)0x0;
        goto LAB_001262d0;
      }
      pRVar4 = (RaviArray *)(t->value_).gc;
      if ((pRVar4->tt == '\x15') || (pRVar4->tt == '%')) {
        if (key->tt_ != 0x13) goto LAB_0012648a;
        if (val->tt_ == 3) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = (val->value_).n;
          auVar9 = vroundsd_avx(auVar9,auVar9,9);
          dVar8 = auVar9._0_8_;
          if (((dVar8 == (val->value_).n) && (-9.223372036854776e+18 <= dVar8)) &&
             (dVar8 < 9.223372036854776e+18)) {
            VVar7.i = (lua_Integer)dVar8;
            uVar5 = (key->value_).i & 0xffffffff;
            if (pRVar4->len <= (uint)(key->value_).b) goto LAB_00126446;
            pcVar6 = pRVar4->data;
            goto LAB_00126433;
          }
        }
        else if (val->tt_ == 0x13) {
          uVar5 = (key->value_).i & 0xffffffff;
          if (pRVar4->len <= (uint)(key->value_).b) {
            VVar7 = (Value)(val->value_).i;
LAB_00126446:
            raviH_set_int(L,pRVar4,uVar5,VVar7.i);
            return;
          }
          pcVar6 = pRVar4->data;
          VVar7 = val->value_;
LAB_00126433:
          *(Value *)(pcVar6 + uVar5 * 8) = VVar7;
          return;
        }
        pcVar6 = "value cannot be converted to integer";
LAB_001264b5:
        luaG_runerror(L,pcVar6);
      }
    }
    pcVar6 = 
    "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
    ;
    goto LAB_00126472;
  }
  if (key->tt_ == 0x13) {
    t_00 = (Table *)(t->value_).gc;
    if (t_00->tt != '\x05') {
LAB_00126459:
      pcVar6 = "(((t)->value_).gc)->tt == 5";
      goto LAB_00126472;
    }
    uVar5 = (key->value_).i - 1;
    if (uVar5 < t_00->sizearray) {
      slot = t_00->array + uVar5;
    }
    else {
      slot = luaH_getint(t_00,(key->value_).i);
    }
  }
  else {
    if (((Table *)(t->value_).gc)->tt != '\x05') goto LAB_00126459;
    slot = luaH_get((Table *)(t->value_).gc,key);
  }
  if (slot->tt_ == 0) {
LAB_001262d0:
    luaV_finishset(L,t,key,val,slot);
    return;
  }
  pGVar3 = (val->value_).gc;
  (slot->value_).gc = pGVar3;
  uVar2 = val->tt_;
  slot->tt_ = uVar2;
  if (-1 < (short)uVar2) {
    return;
  }
  if (((uVar2 & 0x7f) == (ushort)pGVar3->tt) &&
     ((L == (lua_State *)0x0 || ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
    if ((short)t->tt_ < 0) {
      if ((((t->value_).gc)->marked & 0x20) == 0) {
        return;
      }
      if ((((val->value_).gc)->marked & 0x18) == 0) {
        return;
      }
      luaC_barrierback_(L,(t->value_).gc);
      return;
    }
    pcVar6 = "(((t)->tt_) & (1 << 15))";
  }
  else {
    pcVar6 = "0";
  }
LAB_00126472:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE(L, t, key, val);
}